

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::DefaultMinimize::attach(DefaultMinimize *this,Solver *s)

{
  bool bVar1;
  ValueRep VVar2;
  uint32 uVar3;
  size_type sVar4;
  wsum_t *pwVar5;
  UndoInfo *pUVar6;
  DefaultMinimize *this_00;
  long lVar7;
  uint32 *in_RSI;
  DefaultMinimize *in_RDI;
  size_type i;
  WeightLiteral *it;
  VarVec up;
  uint32 numL;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined2 in_stack_fffffffffffffeee;
  Solver *in_stack_fffffffffffffef0;
  Solver *in_stack_fffffffffffffef8;
  uint32 n;
  uint32 *data;
  DefaultMinimize *in_stack_ffffffffffffff00;
  Solver *s_00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  Literal LVar8;
  undefined4 in_stack_ffffffffffffff14;
  Solver *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  UndoInfo *pUVar9;
  UndoInfo *local_d8;
  size_type local_64;
  SharedData *local_30;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  int local_14;
  uint32 *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_30 = (in_RDI->super_MinimizeConstraint).shared_ + 1;
  while (bVar1 = isSentinel((Literal)0x0), ((bVar1 ^ 0xffU) & 1) != 0) {
    Literal::var((Literal *)local_30);
    VVar2 = Solver::value(in_stack_fffffffffffffef0,
                          CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
    if (VVar2 == '\0') {
      Solver::addWatch(in_stack_ffffffffffffff18,
                       (Literal)(uint32)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (Constraint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (uint32)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    else {
      bVar1 = Solver::isTrue(in_stack_fffffffffffffef8,
                             (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      if (bVar1) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_ffffffffffffff00,(uint *)in_stack_fffffffffffffef8);
      }
    }
    local_30 = (SharedData *)&(local_30->adjust_).ebo_.size;
    local_14 = local_14 + 1;
  }
  uVar3 = numRules(in_RDI);
  n = (uint32)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  pwVar5 = (wsum_t *)
           operator_new__((ulong)(uVar3 * (4 - (uint)((*(uint *)&(in_RDI->step_).field_0x4 &
                                                      0xc0000000) == 0))) << 3);
  in_RDI->bounds_ = pwVar5;
  opt(in_RDI);
  sum(in_RDI);
  SharedMinimizeData::maxBound();
  std::fill<long*,long>
            ((long *)in_stack_fffffffffffffef0,
             (long *)CONCAT26(in_stack_fffffffffffffeee,
                              CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
             (long *)0x1ae3f9);
  sum(in_RDI);
  end(in_RDI);
  std::fill<long*,long>
            ((long *)in_stack_fffffffffffffef0,
             (long *)CONCAT26(in_stack_fffffffffffffeee,
                              CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
             (long *)0x1ae446);
  stepInit(in_stack_ffffffffffffff00,n);
  lVar7 = (ulong)(uint)(local_14 * 2) + 1;
  pUVar6 = (UndoInfo *)operator_new__((ulong)(uint)(local_14 * 2) * 4 + 4);
  if (lVar7 != 0) {
    pUVar9 = pUVar6 + lVar7;
    local_d8 = pUVar6;
    do {
      UndoInfo::UndoInfo((UndoInfo *)&local_d8->data);
      local_d8 = local_d8 + 1;
    } while (local_d8 != pUVar9);
  }
  in_RDI->undo_ = pUVar6;
  in_RDI->undoTop_ = 0;
  in_RDI->posTop_ = local_14 + 1;
  in_RDI->actLev_ = 0;
  local_64 = 0;
  while (LVar8.rep_ = local_64,
        sVar4 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28),
        LVar8.rep_ != sVar4) {
    s_00 = (Solver *)((in_RDI->super_MinimizeConstraint).shared_ + 1);
    data = local_10;
    this_00 = (DefaultMinimize *)
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&local_28,local_64);
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,local_64);
    propagate(this_00,s_00,LVar8,data);
    local_64 = local_64 + 1;
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::~pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ae61b);
  return true;
}

Assistant:

bool DefaultMinimize::attach(Solver& s) {
	assert(s.decisionLevel() == 0 && !bounds_);
	uint32 numL = 0;
	VarVec up;
	for (const WeightLiteral* it = shared_->lits; !isSentinel(it->first); ++it, ++numL) {
		if (s.value(it->first.var()) == value_free) {
			s.addWatch(it->first, this, numL);
		}
		else if (s.isTrue(it->first)) {
			up.push_back(numL);
		}
	}
	bounds_ = new wsum_t[(numRules() * (3 + uint32(step_.type != 0)))]; // upper, sum, temp, lower
	std::fill(this->opt(), this->sum(), SharedData::maxBound());
	std::fill(this->sum(), this->end(), wsum_t(0));
	stepInit(0);
	// [0,numL+1)      : undo stack
	// [numL+1, numL*2): pos  stack
	undo_    = new UndoInfo[(numL*2)+1];
	undoTop_ = 0;
	posTop_  = numL+1;
	actLev_  = 0;
	for (WeightVec::size_type i = 0; i != up.size(); ++i) {
		DefaultMinimize::propagate(s, shared_->lits[up[i]].first, up[i]);
	}
	return true;
}